

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# safecrt.h
# Opt level: O1

errno_t strncpy_s(char *_Dst,size_t _SizeInBytes,char *_Src,size_t _Count)

{
  char cVar1;
  size_t __n;
  ulong uVar2;
  errno_t eVar3;
  size_t sVar4;
  char *__s;
  long lVar5;
  long lVar6;
  size_t sVar7;
  long lVar8;
  
  eVar3 = 0;
  if ((_Count == 0 && _SizeInBytes == 0) && _Dst == (char *)0x0) {
    return 0;
  }
  if (_Dst == (char *)0x0 || _SizeInBytes == 0) {
LAB_0010e000:
    RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
    eVar3 = 0x16;
  }
  else {
    if (_Count == 0) {
      *_Dst = '\0';
      if (_SizeInBytes < 2) {
        return 0;
      }
      __s = _Dst + 1;
      __n = _SizeInBytes - 1;
    }
    else {
      if (_Src == (char *)0x0) {
        *_Dst = '\0';
        if (1 < _SizeInBytes) {
          memset(_Dst + 1,0xfd,_SizeInBytes - 1);
        }
        goto LAB_0010e000;
      }
      sVar7 = _SizeInBytes;
      if (_Count == 0xffffffffffffffff) {
        lVar6 = 0;
        do {
          cVar1 = _Src[lVar6];
          _Dst[lVar6] = cVar1;
          if (cVar1 == '\0') goto LAB_0010e0db;
          lVar6 = lVar6 + 1;
          sVar7 = sVar7 - 1;
        } while (sVar7 != 0);
        sVar7 = 0;
      }
      else {
        lVar5 = _Count - _SizeInBytes;
        sVar4 = _SizeInBytes - _Count;
        lVar6 = 0;
        do {
          lVar8 = lVar6;
          cVar1 = _Src[lVar8];
          _Dst[lVar8] = cVar1;
          if (cVar1 == '\0') goto LAB_0010e0c9;
          if (sVar7 == 1) {
            sVar7 = 0;
            _Count = lVar5 + 1;
            goto LAB_0010e0c9;
          }
          sVar7 = sVar7 - 1;
          _Count = _Count - 1;
          lVar6 = lVar8 + 1;
        } while (_Count != 0);
        sVar7 = sVar4;
        _Count = 0;
LAB_0010e0c9:
        if (_Count == 0) {
          _Dst[lVar8 + 1] = '\0';
          _Count = 0;
        }
      }
LAB_0010e0db:
      if (sVar7 == 0) {
        if (_Count != 0xffffffffffffffff) {
          *_Dst = '\0';
          if (1 < _SizeInBytes) {
            memset(_Dst + 1,0xfd,_SizeInBytes - 1);
          }
          RaiseException(0xc000000d,0,0,(ULONG_PTR *)0x0);
          return 0x22;
        }
        _Dst[_SizeInBytes - 1] = '\0';
        return 0x50;
      }
      uVar2 = (_SizeInBytes - sVar7) + 1;
      __n = _SizeInBytes - uVar2;
      if (_SizeInBytes < uVar2 || __n == 0) {
        return 0;
      }
      __s = _Dst + uVar2;
    }
    memset(__s,0xfd,__n);
  }
  return eVar3;
}

Assistant:

_SAFECRT__INLINE
errno_t __cdecl strncpy_s(char *_Dst, size_t _SizeInBytes, const char *_Src, size_t _Count)
{
    char *p;
    size_t available;

    if (_Count == 0 && _Dst == nullptr && _SizeInBytes == 0)
    {
        /* this case is allowed; nothing to do */
        return 0;
    }

    /* validation section */
    _SAFECRT__VALIDATE_STRING(_Dst, _SizeInBytes);
    if (_Count == 0)
    {
        /* notice that the source string pointer can be nullptr in this case */
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        return 0;
    }
    _SAFECRT__VALIDATE_POINTER_RESET_STRING(_Src, _Dst, _SizeInBytes);

    p = _Dst;
    available = _SizeInBytes;
    if (_Count == _TRUNCATE)
    {
        while ((*p++ = *_Src++) != 0 && --available > 0)
        {
        }
    }
    else
    {
        while ((*p++ = *_Src++) != 0 && --available > 0 && --_Count > 0)
        {
        }
        if (_Count == 0)
        {
            *p = 0;
        }
    }

    if (available == 0)
    {
        if (_Count == _TRUNCATE)
        {
            _Dst[_SizeInBytes - 1] = 0;
            return STRUNCATE;
        }
        _SAFECRT__RESET_STRING(_Dst, _SizeInBytes);
        _SAFECRT__RETURN_BUFFER_TOO_SMALL(_Dst, _SizeInBytes);
    }
    _SAFECRT__FILL_STRING(_Dst, _SizeInBytes, _SizeInBytes - available + 1);
    return 0;
}